

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_empty_env(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  uv_process_options_t *puVar7;
  long *plVar8;
  int64_t eval_b;
  int64_t eval_a;
  char *env [1];
  uv_stdio_container_t uStack_180;
  undefined4 uStack_170;
  undefined1 *puStack_168;
  undefined1 auStack_160 [232];
  long *plStack_78;
  code *pcStack_70;
  long lStack_68;
  long lStack_60;
  code *pcStack_58;
  undefined1 *puStack_50;
  long lStack_48;
  uv_process_options_t *puStack_40;
  undefined8 uStack_38;
  long local_28;
  long local_20;
  char *local_18;
  
  plVar8 = &local_28;
  pcVar2 = getenv("DYLD_LIBRARY_PATH");
  if (((pcVar2 != (char *)0x0) || (pcVar2 = getenv("LD_LIBRARY_PATH"), pcVar2 != (char *)0x0)) ||
     (pcVar2 = getenv("LIBPATH"), pcVar2 != (char *)0x0)) {
    run_test_spawn_empty_env_cold_1();
    return 7;
  }
  init_process_options("spawn_helper1",exit_cb);
  options.env = &local_18;
  puVar7 = &options;
  uVar4 = 0;
  local_18 = (char *)0x0;
  uVar3 = uv_default_loop();
  iVar1 = uv_spawn(uVar3,&process,&options);
  local_20 = (long)iVar1;
  local_28 = 0;
  if (local_20 == 0) {
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001bec11;
    local_20 = 1;
    local_28 = (long)exit_cb_called;
    if (local_28 != 1) goto LAB_001bec1e;
    local_20 = 1;
    local_28 = (long)close_cb_called;
    if (local_28 != 1) goto LAB_001bec2b;
    uVar4 = uv_default_loop();
    puVar7 = (uv_process_options_t *)0x0;
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    local_20 = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    local_28 = (long)iVar1;
    if (local_20 == local_28) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_empty_env_cold_2();
LAB_001bec11:
    run_test_spawn_empty_env_cold_3();
LAB_001bec1e:
    run_test_spawn_empty_env_cold_4();
LAB_001bec2b:
    run_test_spawn_empty_env_cold_5();
  }
  plVar5 = &local_20;
  run_test_spawn_empty_env_cold_6();
  pcStack_58 = (code *)0x1bec61;
  puStack_40 = puVar7;
  uStack_38 = uVar4;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  lStack_48 = 1;
  if (plVar8 == (long *)0x1) {
    lStack_48 = (long)extraout_EDX;
    puStack_50 = (undefined1 *)0x0;
    if (lStack_48 == 0) {
      iVar1 = uv_close(plVar5,close_cb);
      return iVar1;
    }
  }
  else {
    pcStack_58 = (code *)0x1becbe;
    puStack_50 = (undefined1 *)plVar8;
    exit_cb_cold_1();
  }
  pcStack_58 = run_test_spawn_exit_code;
  exit_cb_cold_2();
  pcStack_70 = (code *)0x1bece3;
  pcStack_58 = (code *)plVar5;
  init_process_options("spawn_helper1",exit_cb);
  pcStack_70 = (code *)0x1bece8;
  uVar3 = uv_default_loop();
  pcStack_70 = (code *)0x1becfe;
  iVar1 = uv_spawn(uVar3,&process,&options);
  lStack_60 = (long)iVar1;
  lStack_68 = 0;
  if (lStack_60 == 0) {
    pcStack_70 = (code *)0x1bed21;
    uVar3 = uv_default_loop();
    pcStack_70 = (code *)0x1bed2b;
    iVar1 = uv_run(uVar3,0);
    lStack_60 = (long)iVar1;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_001bedef;
    lStack_60 = 1;
    lStack_68 = (long)exit_cb_called;
    if (lStack_68 != 1) goto LAB_001bedfc;
    lStack_60 = 1;
    lStack_68 = (long)close_cb_called;
    if (lStack_68 != 1) goto LAB_001bee09;
    pcStack_70 = (code *)0x1bed90;
    plVar5 = (long *)uv_default_loop();
    pcStack_70 = (code *)0x1beda4;
    uv_walk(plVar5,close_walk_cb,0);
    pcStack_70 = (code *)0x1bedae;
    uv_run(plVar5,0);
    lStack_60 = 0;
    pcStack_70 = (code *)0x1bedbc;
    uVar3 = uv_default_loop();
    pcStack_70 = (code *)0x1bedc4;
    iVar1 = uv_loop_close(uVar3);
    lStack_68 = (long)iVar1;
    if (lStack_60 == lStack_68) {
      pcStack_70 = (code *)0x1bedda;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_70 = (code *)0x1bedef;
    run_test_spawn_exit_code_cold_1();
LAB_001bedef:
    pcStack_70 = (code *)0x1bedfc;
    run_test_spawn_exit_code_cold_2();
LAB_001bedfc:
    pcStack_70 = (code *)0x1bee09;
    run_test_spawn_exit_code_cold_3();
LAB_001bee09:
    pcStack_70 = (code *)0x1bee16;
    run_test_spawn_exit_code_cold_4();
  }
  pcStack_70 = run_test_spawn_stdout;
  run_test_spawn_exit_code_cold_5();
  plStack_78 = plVar5;
  pcStack_70 = (code *)plVar8;
  init_process_options("spawn_helper2",exit_cb);
  uVar3 = uv_default_loop();
  uv_pipe_init(uVar3,auStack_160,0);
  options.stdio = &uStack_180;
  uStack_180.flags = UV_IGNORE;
  uStack_170 = 0x21;
  options.stdio_count = 2;
  puStack_168 = auStack_160;
  uVar3 = uv_default_loop();
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_read_start(auStack_160,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_001bf011;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_001bf01e;
    if (exit_cb_called != 1) goto LAB_001bf02b;
    if (close_cb_called != 2) goto LAB_001bf038;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\n",output);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bf052;
    }
  }
  else {
    run_test_spawn_stdout_cold_1();
LAB_001bf011:
    run_test_spawn_stdout_cold_2();
LAB_001bf01e:
    run_test_spawn_stdout_cold_3();
LAB_001bf02b:
    run_test_spawn_stdout_cold_4();
LAB_001bf038:
    run_test_spawn_stdout_cold_5();
  }
  run_test_spawn_stdout_cold_6();
LAB_001bf052:
  run_test_spawn_stdout_cold_7();
  iVar1 = output_used;
  lVar6 = (long)output_used;
  *extraout_RDX = output + lVar6;
  extraout_RDX[1] = 0x400 - lVar6;
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_empty_env) {
  char* env[1];

  /* The autotools dynamic library build requires the presence of
   * DYLD_LIBARY_PATH (macOS) or LD_LIBRARY_PATH/LIBPATH (other Unices)
   * in the environment, but of course that doesn't work with
   * the empty environment that we're testing here.
   */
  if (NULL != getenv("DYLD_LIBRARY_PATH") ||
      NULL != getenv("LD_LIBRARY_PATH") ||
      NULL != getenv("LIBPATH")) {
    RETURN_SKIP("doesn't work with DYLD_LIBRARY_PATH/LD_LIBRARY_PATH/LIBPATH");
  }

  init_process_options("spawn_helper1", exit_cb);
  options.env = env;
  env[0] = NULL;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}